

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cpp
# Opt level: O1

void linkFiles(string *typeName,uint32_t prevFileLink,uint32_t nextFileLink)

{
  pointer pcVar1;
  bool bVar2;
  uint32_t uVar3;
  char cVar4;
  char cVar5;
  undefined8 *puVar6;
  long *plVar7;
  ulong *puVar8;
  uint32_t uVar9;
  ulong uVar10;
  undefined8 uVar11;
  ulong uVar12;
  string __str;
  fstream prevFile;
  uint32_t local_34c;
  ulong *local_348;
  uint local_340;
  undefined4 uStack_33c;
  ulong local_338 [2];
  long *local_328;
  undefined8 local_320;
  long local_318;
  undefined8 uStack_310;
  long *local_308;
  undefined8 local_300;
  long local_2f8;
  undefined8 uStack_2f0;
  ulong *local_2e8;
  long local_2e0;
  ulong local_2d8;
  long lStack_2d0;
  uint32_t local_2c4;
  string local_2c0;
  ulong *local_2a0;
  long local_298;
  ulong local_290 [2];
  string local_280;
  string local_260;
  undefined1 local_240 [16];
  char local_230 [512];
  
  local_34c = nextFileLink;
  local_2c4 = prevFileLink;
  if (prevFileLink != 0) {
    local_2a0 = local_290;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"data/","");
    pcVar1 = (typeName->_M_dataplus)._M_p;
    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_260,pcVar1,pcVar1 + typeName->_M_string_length);
    truncateName(&local_2c0,&local_260);
    uVar10 = 0xf;
    if (local_2a0 != local_290) {
      uVar10 = local_290[0];
    }
    if (uVar10 < local_2c0._M_string_length + local_298) {
      uVar11 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
        uVar11 = local_2c0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar11 < local_2c0._M_string_length + local_298) goto LAB_0010ad3c;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_2c0,0,(char *)0x0,(ulong)local_2a0);
    }
    else {
LAB_0010ad3c:
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_2a0,(ulong)local_2c0._M_dataplus._M_p)
      ;
    }
    local_328 = &local_318;
    plVar7 = puVar6 + 2;
    if ((long *)*puVar6 == plVar7) {
      local_318 = *plVar7;
      uStack_310 = puVar6[3];
    }
    else {
      local_318 = *plVar7;
      local_328 = (long *)*puVar6;
    }
    local_320 = puVar6[1];
    *puVar6 = plVar7;
    puVar6[1] = 0;
    *(undefined1 *)plVar7 = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_328);
    uVar3 = local_2c4;
    puVar8 = (ulong *)(plVar7 + 2);
    if ((ulong *)*plVar7 == puVar8) {
      local_2d8 = *puVar8;
      lStack_2d0 = plVar7[3];
      local_2e8 = &local_2d8;
    }
    else {
      local_2d8 = *puVar8;
      local_2e8 = (ulong *)*plVar7;
    }
    local_2e0 = plVar7[1];
    *plVar7 = (long)puVar8;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    cVar5 = '\x01';
    if (9 < local_2c4) {
      uVar9 = local_2c4;
      cVar4 = '\x04';
      do {
        cVar5 = cVar4;
        if (uVar9 < 100) {
          cVar5 = cVar5 + -2;
          goto LAB_0010ae5f;
        }
        if (uVar9 < 1000) {
          cVar5 = cVar5 + -1;
          goto LAB_0010ae5f;
        }
        if (uVar9 < 10000) goto LAB_0010ae5f;
        bVar2 = 99999 < uVar9;
        uVar9 = uVar9 / 10000;
        cVar4 = cVar5 + '\x04';
      } while (bVar2);
      cVar5 = cVar5 + '\x01';
    }
LAB_0010ae5f:
    local_348 = local_338;
    std::__cxx11::string::_M_construct((ulong)&local_348,cVar5);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_348,local_340,uVar3);
    uVar10 = CONCAT44(uStack_33c,local_340) + local_2e0;
    uVar12 = 0xf;
    if (local_2e8 != &local_2d8) {
      uVar12 = local_2d8;
    }
    if (uVar12 < uVar10) {
      uVar12 = 0xf;
      if (local_348 != local_338) {
        uVar12 = local_338[0];
      }
      if (uVar12 < uVar10) goto LAB_0010aec6;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_348,0,(char *)0x0,(ulong)local_2e8);
    }
    else {
LAB_0010aec6:
      puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2e8,(ulong)local_348);
    }
    local_308 = &local_2f8;
    plVar7 = puVar6 + 2;
    if ((long *)*puVar6 == plVar7) {
      local_2f8 = *plVar7;
      uStack_2f0 = puVar6[3];
    }
    else {
      local_2f8 = *plVar7;
      local_308 = (long *)*puVar6;
    }
    local_300 = puVar6[1];
    *puVar6 = plVar7;
    puVar6[1] = 0;
    *(undefined1 *)plVar7 = 0;
    std::fstream::fstream(local_240,(string *)&local_308,_S_out|_S_in|_S_bin);
    if (local_308 != &local_2f8) {
      operator_delete(local_308,local_2f8 + 1);
    }
    if (local_348 != local_338) {
      operator_delete(local_348,local_338[0] + 1);
    }
    if (local_2e8 != &local_2d8) {
      operator_delete(local_2e8,local_2d8 + 1);
    }
    if (local_328 != &local_318) {
      operator_delete(local_328,local_318 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
      operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    if (local_2a0 != local_290) {
      operator_delete(local_2a0,local_290[0] + 1);
    }
    std::ostream::seekp(local_230,0x12,0);
    std::ostream::write(local_230,(long)&local_34c);
    std::fstream::close();
    std::fstream::~fstream(local_240);
  }
  if (local_34c == 0) {
    return;
  }
  local_2a0 = local_290;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"data/","");
  pcVar1 = (typeName->_M_dataplus)._M_p;
  local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_280,pcVar1,pcVar1 + typeName->_M_string_length);
  truncateName(&local_2c0,&local_280);
  uVar10 = 0xf;
  if (local_2a0 != local_290) {
    uVar10 = local_290[0];
  }
  if (uVar10 < local_2c0._M_string_length + local_298) {
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
      uVar11 = local_2c0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar11 < local_2c0._M_string_length + local_298) goto LAB_0010b105;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_2c0,0,(char *)0x0,(ulong)local_2a0);
  }
  else {
LAB_0010b105:
    puVar6 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_2a0,(ulong)local_2c0._M_dataplus._M_p);
  }
  local_328 = &local_318;
  plVar7 = puVar6 + 2;
  if ((long *)*puVar6 == plVar7) {
    local_318 = *plVar7;
    uStack_310 = puVar6[3];
  }
  else {
    local_318 = *plVar7;
    local_328 = (long *)*puVar6;
  }
  local_320 = puVar6[1];
  *puVar6 = plVar7;
  puVar6[1] = 0;
  *(undefined1 *)plVar7 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_328);
  uVar3 = local_34c;
  puVar8 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar8) {
    local_2d8 = *puVar8;
    lStack_2d0 = plVar7[3];
    local_2e8 = &local_2d8;
  }
  else {
    local_2d8 = *puVar8;
    local_2e8 = (ulong *)*plVar7;
  }
  local_2e0 = plVar7[1];
  *plVar7 = (long)puVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  cVar5 = '\x01';
  if (9 < local_34c) {
    uVar9 = local_34c;
    cVar4 = '\x04';
    do {
      cVar5 = cVar4;
      if (uVar9 < 100) {
        cVar5 = cVar5 + -2;
        goto LAB_0010b225;
      }
      if (uVar9 < 1000) {
        cVar5 = cVar5 + -1;
        goto LAB_0010b225;
      }
      if (uVar9 < 10000) goto LAB_0010b225;
      bVar2 = 99999 < uVar9;
      uVar9 = uVar9 / 10000;
      cVar4 = cVar5 + '\x04';
    } while (bVar2);
    cVar5 = cVar5 + '\x01';
  }
LAB_0010b225:
  local_348 = local_338;
  std::__cxx11::string::_M_construct((ulong)&local_348,cVar5);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_348,local_340,uVar3);
  uVar10 = CONCAT44(uStack_33c,local_340) + local_2e0;
  uVar12 = 0xf;
  if (local_2e8 != &local_2d8) {
    uVar12 = local_2d8;
  }
  if (uVar12 < uVar10) {
    uVar12 = 0xf;
    if (local_348 != local_338) {
      uVar12 = local_338[0];
    }
    if (uVar10 <= uVar12) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_348,0,(char *)0x0,(ulong)local_2e8);
      goto LAB_0010b2ab;
    }
  }
  puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2e8,(ulong)local_348);
LAB_0010b2ab:
  local_308 = &local_2f8;
  plVar7 = puVar6 + 2;
  if ((long *)*puVar6 == plVar7) {
    local_2f8 = *plVar7;
    uStack_2f0 = puVar6[3];
  }
  else {
    local_2f8 = *plVar7;
    local_308 = (long *)*puVar6;
  }
  local_300 = puVar6[1];
  *puVar6 = plVar7;
  puVar6[1] = 0;
  *(undefined1 *)plVar7 = 0;
  std::fstream::fstream(local_240,(string *)&local_308,_S_out|_S_in|_S_bin);
  if (local_308 != &local_2f8) {
    operator_delete(local_308,local_2f8 + 1);
  }
  if (local_348 != local_338) {
    operator_delete(local_348,local_338[0] + 1);
  }
  if (local_2e8 != &local_2d8) {
    operator_delete(local_2e8,local_2d8 + 1);
  }
  if (local_328 != &local_318) {
    operator_delete(local_328,local_318 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  if (local_2a0 != local_290) {
    operator_delete(local_2a0,local_290[0] + 1);
  }
  std::ostream::seekp(local_230,0xe,0);
  std::ostream::write(local_230,(long)&local_2c4);
  std::fstream::close();
  std::fstream::~fstream(local_240);
  return;
}

Assistant:

void linkFiles(const string typeName, uint32_t prevFileLink, uint32_t nextFileLink) {
    if (prevFileLink != 0) {
        fstream prevFile(ROOT + truncateName(typeName) + INFIX + to_string(prevFileLink), INOUTBIN);

        prevFile.seekp(IS_FULL + TYPE_NAME + NUM_PAGES + NUM_RECORDS + LINK_TO_FILE);
        prevFile.write((char *) &nextFileLink, LINK_TO_FILE);

        prevFile.close();
    }

    if (nextFileLink != 0) {
        fstream nextFile(ROOT + truncateName(typeName) + INFIX + to_string(nextFileLink), INOUTBIN);

        nextFile.seekp(IS_FULL + TYPE_NAME + NUM_PAGES + NUM_RECORDS);
        nextFile.write((char *) &prevFileLink, LINK_TO_FILE);

        nextFile.close();
    }
}